

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

void __thiscall ArmParser::parseSign(ArmParser *this,Parser *parser,bool *dest)

{
  Token *pTVar1;
  bool *dest_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  pTVar1 = Parser::peekToken(parser,0);
  if (pTVar1->type == Plus) {
    *dest = true;
    Parser::eatToken(parser);
  }
  else if (pTVar1->type == Minus) {
    *dest = false;
    Parser::eatToken(parser);
  }
  else {
    *dest = true;
  }
  return;
}

Assistant:

void ArmParser::parseSign(Parser& parser, bool& dest)
{
	switch (parser.peekToken().type)
	{
	case TokenType::Plus:
		dest = true;
		parser.eatToken();
		break;
	case TokenType::Minus:
		dest = false;
		parser.eatToken();
		break;
	default:
		dest = true;
		break;
	}
}